

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O3

void readQuotedString(istream *is,string *str)

{
  byte bVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  char ch;
  char local_cd;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x10c476);
  do {
    plVar3 = (long *)std::istream::get((char *)is);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
    iVar2 = isspace((int)local_cd);
  } while (iVar2 != 0);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    if ((local_cd == '\'') || (local_cd == '\"')) {
      std::istream::get((char *)is);
    }
    else {
      std::__cxx11::string::push_back((char)str);
      plVar3 = (long *)std::istream::get((char *)is);
      bVar1 = *(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20);
      while (((bVar1 & 5) == 0 &&
             (lVar4 = std::__cxx11::string::find(-0x50,(ulong)(uint)(int)local_cd), lVar4 == -1))) {
        std::__cxx11::string::push_back((char)str);
        isspace((int)local_cd);
        plVar3 = (long *)std::istream::get((char *)is);
        bVar1 = *(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20);
      }
      if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
        std::istream::unget();
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)str);
      std::__cxx11::string::operator=((string *)str,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void readQuotedString(istream & is, string & str) {
   str = "";
   char ch;
   while (is.get(ch) && isspace(ch)) {
      /* Empty */
   }
   if (is.fail()) return;
   if (ch == '\'' || ch == '"') {
      char delim = ch;
      while (is.get(ch) && ch != delim) {
         if (is.fail()) error("Unterminated string");
         if (ch == '\\') {
            if (!is.get(ch)) error("Unterminated string");
            if (isdigit(ch) || ch == 'x') {
               int maxDigits = 3;
               int base = 8;
               if (ch == 'x') {
                  base = 16;
                  maxDigits = 2;
               }
               int result = 0;
               int digit = 0;
               for (int i = 0; i < maxDigits && ch != delim; i++) {
                  if (isdigit(ch)) {
                     digit = ch - '0';
                  } else if (base == 16 && isxdigit(ch)) {
                     digit = toupper(ch) - 'A' + 10;
                  } else {
                     break;
                  }
                  result = base * result + digit;
                  if (!is.get(ch)) error("Unterminated string");
               }
               ch = char(result);
               is.unget();
            } else {
               switch (ch) {
                case 'a': ch = '\a'; break;
                case 'b': ch = '\b'; break;
                case 'f': ch = '\f'; break;
                case 'n': ch = '\n'; break;
                case 'r': ch = '\r'; break;
                case 't': ch = '\t'; break;
                case 'v': ch = '\v'; break;
                case '"': ch = '"'; break;
                case '\'': ch = '\''; break;
                case '\\': ch = '\\'; break;
               }
            }
         }
         str += ch;
      }
   } else {
      str += ch;
      int endTrim = 0;
      while (is.get(ch) && STRING_DELIMITERS.find(ch) == string::npos) {
         str += ch;
         if (!isspace(ch)) endTrim = str.length();
      }
      if (is) is.unget();
      str = str.substr(0, endTrim);
   }
}